

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O0

pair<vec3f,_vec3f> * __thiscall
BsplineCurve::atParam(pair<vec3f,_vec3f> *__return_storage_ptr__,BsplineCurve *this,double t)

{
  long lVar1;
  pair<vec3f,_vec3f> *this_00;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  vector<vec3f,_std::allocator<vec3f>_> *pvVar5;
  double dVar6;
  vec3f vVar7;
  vector<vec3f,_std::allocator<vec3f>_> *pvStack_120;
  vector<vec3f,_std::allocator<vec3f>_> *local_118;
  bool local_109;
  undefined8 local_108;
  pair<vec3f,_vec3f> *local_100;
  BsplineCurve *local_f8;
  long local_f0;
  vec3f local_e8;
  vec3f local_d4;
  vec3f local_c8;
  vec3f local_b8;
  undefined8 local_a8;
  float local_a0;
  vec3f local_9c;
  vec3f local_90;
  vec3f local_80;
  int local_74;
  double dStack_70;
  int i_2;
  double t0;
  vec3f der;
  vec3f res;
  int i_1;
  int p;
  int i;
  unsigned_long __vla_expr0;
  double tmax;
  double tmin;
  int k;
  int n;
  double t_local;
  BsplineCurve *this_local;
  
  pvStack_120 = (vector<vec3f,_std::allocator<vec3f>_> *)0x17e946;
  local_108 = __return_storage_ptr__;
  local_100 = __return_storage_ptr__;
  local_f8 = this;
  sVar3 = std::vector<vec3f,_std::allocator<vec3f>_>::size(&(this->super_Curve).controls);
  iVar2 = (int)sVar3;
  dVar6 = 3.0 / (double)(iVar2 + 3);
  dVar6 = t * ((double)iVar2 / (double)(iVar2 + 3) - dVar6) + dVar6;
  uVar4 = (ulong)(iVar2 + 3);
  lVar1 = uVar4 * -0x20;
  local_f0 = (long)&local_118 + uVar4 * -0x20;
  for (i_1 = 0; i_1 < iVar2 + 3; i_1 = i_1 + 1) {
    local_109 = false;
    if ((double)i_1 / (double)(iVar2 + 3) <= dVar6) {
      local_109 = dVar6 < (double)(i_1 + 1) / (double)(iVar2 + 3);
    }
    *(double *)(local_f0 + (long)i_1 * 0x20) = (double)(local_109 != false);
  }
  for (res.z = 1.4013e-45; (int)res.z < 4; res.z = (float)((int)res.z + 1)) {
    for (res.y = 0.0; (int)res.y + (int)res.z < iVar2 + 3; res.y = (float)((int)res.y + 1)) {
      *(double *)(local_f0 + ((long)(int)res.y * 4 + (long)(int)res.z) * 8) =
           ((dVar6 - (double)(int)res.y / (double)(iVar2 + 3)) /
           ((double)((int)res.y + (int)res.z) / (double)(iVar2 + 3) -
           (double)(int)res.y / (double)(iVar2 + 3))) *
           *(double *)(local_f0 + ((long)(int)res.y * 4 + (long)((int)res.z + -1)) * 8) +
           (((double)((int)res.y + (int)res.z + 1) / (double)(iVar2 + 3) - dVar6) /
           ((double)((int)res.y + (int)res.z + 1) / (double)(iVar2 + 3) -
           (double)((int)res.y + 1) / (double)(iVar2 + 3))) *
           *(double *)(local_f0 + ((long)((int)res.y + 1) * 4 + (long)((int)res.z + -1)) * 8);
    }
  }
  (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ebf3;
  vec3f::vec3f((vec3f *)&der.y,0.0);
  (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ebff;
  vec3f::vec3f((vec3f *)((long)&t0 + 4),0.0);
  dStack_70 = 0.0;
  for (local_74 = 0; local_74 <= iVar2 + -1; local_74 = local_74 + 1) {
    pvVar5 = &(local_f8->super_Curve).controls;
    sVar3 = (size_type)local_74;
    local_118 = pvVar5;
    (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ec35;
    std::vector<vec3f,_std::allocator<vec3f>_>::operator[](pvVar5,sVar3);
    (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ec56;
    vVar7 = ::operator*(&(&local_100)[uVar4 * -4]->first,*(float *)((long)&local_108 + lVar1 + 4));
    local_90.z = vVar7.z;
    local_80.z = local_90.z;
    local_90._0_8_ = vVar7._0_8_;
    local_80.x = local_90.x;
    local_80.y = local_90.y;
    local_90 = vVar7;
    (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ec81;
    operator+=((vec3f *)&der.y,&local_80);
    pvVar5 = local_118;
    dStack_70 = dStack_70 + *(double *)(local_f0 + ((long)local_74 * 4 + 3) * 8);
    sVar3 = (size_type)local_74;
    (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ecb4;
    std::vector<vec3f,_std::allocator<vec3f>_>::operator[](pvVar5,sVar3);
    (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ecc4;
    local_b8 = ::operator*(&(&local_100)[uVar4 * -4]->first,*(float *)((long)&local_108 + lVar1 + 4)
                          );
    vVar7 = local_b8;
    local_a0 = local_b8.z;
    local_a8._0_4_ = local_b8.x;
    local_a8._4_4_ = local_b8.y;
    local_b8 = vVar7;
    (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ed65;
    vVar7 = ::operator*(&(&local_100)[uVar4 * -4]->first,*(float *)((long)&local_108 + lVar1 + 4));
    local_c8._0_8_ = vVar7._0_8_;
    local_9c.x = local_c8.x;
    local_9c.y = local_c8.y;
    local_c8.z = vVar7.z;
    local_9c.z = local_c8.z;
    local_c8 = vVar7;
    (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ed9f;
    operator+=((vec3f *)((long)&t0 + 4),&local_9c);
  }
  (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17edc8;
  vVar7 = ::operator*(&(&local_100)[uVar4 * -4]->first,*(float *)((long)&local_108 + lVar1 + 4));
  this_00 = local_108;
  local_e8._0_8_ = vVar7._0_8_;
  local_d4.x = local_e8.x;
  local_d4.y = local_e8.y;
  local_e8.z = vVar7.z;
  local_d4.z = local_e8.z;
  local_e8 = vVar7;
  (&pvStack_120)[uVar4 * -4] = (vector<vec3f,_std::allocator<vec3f>_> *)0x17ee09;
  std::pair<vec3f,_vec3f>::pair<vec3f_&,_vec3f,_true>(this_00,(vec3f *)&der.y,&local_d4);
  return local_100;
}

Assistant:

std::pair<vec3f, vec3f> atParam(double t) const
    {
        const int n = controls.size()-1;
        const int k = 3;
        double tmin = (double)k/(n+k+1);
        double tmax = (double)(n+1)/(n+k+1);
        // de-normalize parameter
        t = tmin + t * (tmax - tmin);

        #define t_(i) ((double)(i)/(n+k+1))
        double B[n+k+1][k+1];
        for (int i=0; i<n+k+1; ++i)
            B[i][0] = (t_(i)<=t && t<t_(i+1))? 1: 0;
        for (int p=1; p<=k; ++p)
            for (int i=0; i+p<n+k+1; ++i)
                B[i][p] = (t-t_(i))/(t_(i+p)-t_(i))*B[i][p-1] + (t_(i+p+1)-t)/(t_(i+p+1)-t_(i+1))*B[i+1][p-1];
        vec3f res(0), der(0);
        double t0=0;
        for (int i=0; i<=n; ++i) {
            res += controls[i] * B[i][k];
            t0 += B[i][k];
            der += controls[i] * k * (B[i][k-1]/(t_(i+k)-t_(i)) - B[i+1][k-1]/(t_(i+k+1)-t_(i+1)));
        }
        #undef t_
        return {res, der * (tmax-tmin)};
    }